

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr
deqp::TestSubcase::Create<glcts::(anonymous_namespace)::SubroutineIndexNonDecimal>(void)

{
  SubroutineIndexNonDecimal *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (SubroutineIndexNonDecimal *)operator_new(0x38);
  (this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.m_context =
       (Context *)0x0;
  (this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator.fValue = 0.0;
  (this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator.iValue = 0;
  (this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
  super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
    super_CallLogWrapper.m_enableLog = 0;
  (this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)0x0;
  (this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
  super_CallLogWrapper.m_gl = (Functions *)0x0;
  *(undefined8 *)&(this->super_ExplicitUniformLocationCaseBase).uniformStructCounter = 0;
  glcts::anon_unknown_0::SubroutineIndexNonDecimal::SubroutineIndexNonDecimal(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}